

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall Generators_Hammersley3D_Test::TestBody(Generators_Hammersley3D_Test *this)

{
  int iVar1;
  uint64_t a;
  char *pcVar2;
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [56];
  undefined1 auVar3 [64];
  undefined1 extraout_var [60];
  Point3f PVar5;
  AssertionResult gtest_ar;
  Hammersley3DIter __begin1;
  float local_50 [2];
  undefined8 local_48;
  float local_40;
  int count;
  AssertHelper local_38;
  
  count = 0;
  a = 0;
  __begin1.super_IndexingIterator<pbrt::detail::Hammersley3DIter>.i = 0;
  __begin1.super_IndexingIterator<pbrt::detail::Hammersley3DIter>.n = 0x80;
  iVar1 = 0;
  while (auVar4 = in_ZMM0._8_56_, iVar1 != 0x80) {
    PVar5 = pbrt::detail::Hammersley3DIter::operator*(&__begin1);
    local_40 = PVar5.super_Tuple3<pbrt::Point3,_float>.z;
    auVar3._0_8_ = PVar5.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar3._8_56_ = auVar4;
    local_48 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               vmovlps_avx(auVar3._0_16_);
    local_50[0] = (float)(int)a * 0.0078125;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&gtest_ar,"(Float)count / 128.f","u[0]",local_50,(float *)&local_48);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)local_50);
      pcVar2 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x49a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_50[0] = pbrt::RadicalInverse(0,a);
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&gtest_ar,"RadicalInverse(0, count)","u[1]",local_50,
               (float *)((long)&local_48 + 4));
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)local_50);
      pcVar2 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x49b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    in_ZMM0._0_4_ = pbrt::RadicalInverse(1,a);
    in_ZMM0._4_60_ = extraout_var;
    local_50[0] = in_ZMM0._0_4_;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&gtest_ar,"RadicalInverse(1, count)","u[2]",local_50,&local_40);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)local_50);
      pcVar2 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x49c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    a = a + 1;
    count = (int)a;
    iVar1 = __begin1.super_IndexingIterator<pbrt::detail::Hammersley3DIter>.i + 1;
    __begin1.super_IndexingIterator<pbrt::detail::Hammersley3DIter>.i = iVar1;
  }
  local_48._0_4_ = 0x80;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"128","count",(int *)&local_48,&count);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__begin1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x49f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__begin1,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__begin1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(Generators, Hammersley3D) {
    int count = 0;
    for (Point3f u : Hammersley3D(128)) {
        EXPECT_EQ((Float)count / 128.f, u[0]);
        EXPECT_EQ(RadicalInverse(0, count), u[1]);
        EXPECT_EQ(RadicalInverse(1, count), u[2]);
        ++count;
    }
    EXPECT_EQ(128, count);
}